

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldIndex_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  once_flag *__once;
  Descriptor *pDVar4;
  char *pcVar5;
  string *extraout_RAX;
  long lVar6;
  int32 i;
  long lVar7;
  FieldDescriptor *local_68;
  _func_void_FieldDescriptor_ptr *local_60;
  long local_58;
  undefined1 local_50 [32];
  
  pDVar1 = *(Descriptor **)(this + 0x50);
  lVar2 = *(long *)(pDVar1 + 0x18);
  if ((lVar2 != 0) && (0 < *(int *)(lVar2 + 0x68))) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar3 = *(long *)(lVar2 + 0x28);
      __once = *(once_flag **)(lVar3 + 0x30 + lVar6);
      if (__once != (once_flag *)0x0) {
        local_68 = (FieldDescriptor *)(lVar3 + lVar6);
        local_60 = FieldDescriptor::TypeOnceInit;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_60,&local_68);
      }
      if (*(int *)(lVar3 + 0x38 + lVar6) == 10) {
        pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)(*(long *)(lVar2 + 0x28) + lVar6))
        ;
        if (pDVar4 == pDVar1) {
          i = *(int *)(this + 0x44) - *(int *)(*(long *)(lVar2 + 0x28) + 0x44 + lVar6);
          goto LAB_0024bd07;
        }
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x98;
    } while (lVar7 < *(int *)(lVar2 + 0x68));
  }
  i = *(int32 *)(this + 0x44);
LAB_0024bd07:
  local_60 = (_func_void_FieldDescriptor_ptr *)local_50;
  pcVar5 = FastInt32ToBufferLeft(i,local_50);
  local_58 = (long)pcVar5 - (long)local_50;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_60,local_60 + local_58);
  return extraout_RAX;
}

Assistant:

std::string JSFieldIndex(const FieldDescriptor* field) {
  // Determine whether this field is a member of a group. Group fields are a bit
  // wonky: their "containing type" is a message type created just for the
  // group, and that type's parent type has a field with the group-message type
  // as its message type and TYPE_GROUP as its field type. For such fields, the
  // index we use is relative to the field number of the group submessage field.
  // For all other fields, we just use the field number.
  const Descriptor* containing_type = field->containing_type();
  const Descriptor* parent_type = containing_type->containing_type();
  if (parent_type != NULL) {
    for (int i = 0; i < parent_type->field_count(); i++) {
      if (parent_type->field(i)->type() == FieldDescriptor::TYPE_GROUP &&
          parent_type->field(i)->message_type() == containing_type) {
        return StrCat(field->number() - parent_type->field(i)->number());
      }
    }
  }
  return StrCat(field->number());
}